

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recorder.cpp
# Opt level: O2

unique_ptr<helics::Message,_std::default_delete<helics::Message>_> __thiscall
helics::apps::Recorder::getMessage(Recorder *this,size_t index)

{
  ulong in_RDX;
  
  if (in_RDX < (ulong)(*(long *)(index + 0x198) - *(long *)(index + 400) >> 3)) {
    std::make_unique<helics::Message,helics::Message&>((Message *)this);
  }
  else {
    (this->super_App)._vptr_App = (_func_int **)0x0;
  }
  return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
         (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Message> Recorder::getMessage(std::size_t index) const
{
    if (isValidIndex(index, messages)) {
        return std::make_unique<Message>(*messages[index]);
    }
    return nullptr;
}